

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenMatrixBaseSerialize.hpp
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
serialize<boost::archive::text_iarchive>
          (PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,text_iarchive *ar,
          uint version)

{
  undefined1 *this_00;
  int i;
  long lVar1;
  int j;
  long lVar2;
  long lVar3;
  long lVar4;
  int c;
  int r;
  int local_38;
  int local_34;
  
  local_34 = (int)(this->m_storage).m_rows;
  local_38 = (int)(this->m_storage).m_cols;
  this_00 = &ar->field_0x28;
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
            &local_34);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
            &local_38);
  resize(this,(long)local_34,(long)local_38);
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < local_38; lVar2 = lVar2 + 1) {
    lVar3 = 0;
    for (lVar1 = 0; lVar1 < local_34; lVar1 = lVar1 + 1) {
      boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
      load<double>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
                   this_00,(double *)
                           ((long)(this->m_storage).m_data +
                           lVar3 + (this->m_storage).m_rows * lVar4));
      lVar3 = lVar3 + 8;
    }
    lVar4 = lVar4 + 8;
  }
  return;
}

Assistant:

inline void serialize(Archive & ar, const unsigned int version)
{
    int r = this->rows();     // makes sense for saving only
    int c = this->cols();

    ar & boost::serialization::make_nvp("rows",r);
    ar & boost::serialization::make_nvp("cols",c);

    this->resize(r,c);        // makes sense for loading only

    for(int j = 0; j < c; j++)
	    for(int i = 0; i < r; i++)
            ar & boost::serialization::make_nvp("data",this->operator()(i,j));
}